

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O3

CordRepFlat * absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(size_t len)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  CordRepFlat *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  sVar3 = 0xff3;
  if (len < 0xff3) {
    sVar3 = len;
  }
  uVar5 = 0x20;
  if (0x13 < len) {
    uVar5 = sVar3 + 0xd;
  }
  uVar6 = 0xffffffffffffffc0;
  lVar7 = uVar5 + 0x40;
  if (uVar5 < 0x201) {
    uVar6 = 0xfffffffffffffff8;
    lVar7 = uVar5 + 8;
  }
  uVar6 = lVar7 - 1U & uVar6;
  cVar2 = (char)(uVar6 >> (0x200 < uVar6) * '\x03' + 3);
  bVar1 = cVar2 + 0x3a;
  if (uVar6 < 0x201) {
    bVar1 = cVar2 + 2;
  }
  pCVar4 = (CordRepFlat *)operator_new(uVar6);
  (pCVar4->super_CordRep).length = 0;
  (pCVar4->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar4->super_CordRep).tag = '\0';
  (pCVar4->super_CordRep).storage[0] = '\0';
  (pCVar4->super_CordRep).storage[1] = '\0';
  (pCVar4->super_CordRep).storage[2] = '\0';
  (pCVar4->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  if (0xf8 < bVar1) {
    __assert_fail("tag <= MAX_FLAT_TAG",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                  ,0x5e,"uint8_t absl::cord_internal::AllocatedSizeToTag(size_t)");
  }
  (pCVar4->super_CordRep).tag = bVar1;
  return pCVar4;
}

Assistant:

static CordRepFlat* NewImpl(size_t len, Args... args ABSL_ATTRIBUTE_UNUSED) {
    if (len <= kMinFlatLength) {
      len = kMinFlatLength;
    } else if (len > max_flat_size - kFlatOverhead) {
      len = max_flat_size - kFlatOverhead;
    }

    // Round size up so it matches a size we can exactly express in a tag.
    const size_t size = RoundUpForTag(len + kFlatOverhead);
    void* const raw_rep = ::operator new(size);
    // GCC 13 has a false-positive -Wstringop-overflow warning here.
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wstringop-overflow"
    #endif
    CordRepFlat* rep = new (raw_rep) CordRepFlat();
    rep->tag = AllocatedSizeToTag(size);
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic pop
    #endif
    return rep;
  }